

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

bool __thiscall HEkkDual::acceptDualSteepestEdgeWeight(HEkkDual *this,double updated_edge_weight)

{
  double computed_edge_weight;
  
  computed_edge_weight = this->computed_edge_weight;
  HEkk::assessDSEWeightError(this->ekk_instance_,computed_edge_weight,updated_edge_weight);
  HighsSimplexAnalysis::dualSteepestEdgeWeightError
            (this->analysis,this->computed_edge_weight,updated_edge_weight);
  return computed_edge_weight * 0.25 <= updated_edge_weight;
}

Assistant:

bool HEkkDual::acceptDualSteepestEdgeWeight(const double updated_edge_weight) {
  // Accept the updated weight if it is at least a quarter of the
  // computed weight. Excessively large updated weights don't matter!
  const bool accept_weight =
      updated_edge_weight >= kAcceptDseWeightThreshold * computed_edge_weight;
  //  if (analysis->analyse_simplex_summary_data)
  ekk_instance_.assessDSEWeightError(computed_edge_weight, updated_edge_weight);
  analysis->dualSteepestEdgeWeightError(computed_edge_weight,
                                        updated_edge_weight);
  return accept_weight;
}